

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O1

void __thiscall cmQtAutoGeneratorRcc::PollStage(cmQtAutoGeneratorRcc *this)

{
  StageT SVar1;
  bool bVar2;
  uint *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  void *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *__buf;
  int in_ESI;
  int in_R8D;
  
  __n = &switchD_001a75a3::switchdataD_004b954c;
  switch(this->Stage_) {
  case SETTINGS_READ:
    bVar2 = SettingsFileRead(this);
    __buf = extraout_RDX;
    if (!bVar2) goto LAB_001a76f1;
    SVar1 = this->Error_ * '\b' + TEST_QRC_RCC_FILES;
    break;
  case TEST_QRC_RCC_FILES:
    bVar2 = TestQrcRccFiles(this);
    __n = (uint *)CONCAT71((int7)((ulong)__n >> 8),this->Stage_);
    __buf = (void *)CONCAT71((int7)((ulong)extraout_RDX_04 >> 8),this->Error_);
    if (bVar2) {
LAB_001a766e:
      SVar1 = (char)__buf * '\x04' + GENERATE;
      __buf = (void *)CONCAT71((int7)((ulong)__buf >> 8),SVar1);
      if (SVar1 <= (StageT)__n) {
        return;
      }
      this->Stage_ = SVar1;
      goto LAB_001a771c;
    }
    __buf = (void *)0x9;
    SVar1 = TEST_RESOURCES_READ;
    if (this->Error_ != false) {
      SVar1 = FINISH;
    }
    goto LAB_001a7712;
  case TEST_RESOURCES_READ:
    bVar2 = TestResourcesRead(this);
    if (!bVar2) {
      return;
    }
    __n = (uint *)0x9;
    SVar1 = TEST_RESOURCES;
    __buf = extraout_RDX_01;
    if (this->Error_ != false) {
      SVar1 = FINISH;
    }
    goto LAB_001a76b9;
  case TEST_RESOURCES:
    bVar2 = TestResources(this);
    __n = (uint *)CONCAT71((int7)((ulong)__n >> 8),this->Stage_);
    __buf = (void *)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),this->Error_);
    if (bVar2) goto LAB_001a766e;
    SVar1 = (this->Error_ != false) * '\x05' + TEST_INFO_FILE;
LAB_001a7712:
    if (SVar1 <= (StageT)__n) {
      return;
    }
LAB_001a7716:
    this->Stage_ = SVar1;
    goto LAB_001a771c;
  case TEST_INFO_FILE:
    TestInfoFile(this);
    __buf = extraout_RDX_00;
    goto LAB_001a76cf;
  case GENERATE:
    in_ESI = 3;
    bVar2 = cmQtAutoGenerator::FileSystem::MakeParentDirectory
                      (&(this->super_cmQtAutoGenerator).FileSys_,RCC,&this->RccFileOutput_);
    if (!bVar2) {
      this->Error_ = true;
    }
    SVar1 = (this->Error_ != false) * '\x03' + GENERATE_RCC;
    __buf = extraout_RDX_05;
LAB_001a76b9:
    if (SVar1 <= this->Stage_) {
      return;
    }
    goto LAB_001a7716;
  case GENERATE_RCC:
    bVar2 = GenerateRcc(this);
    __buf = extraout_RDX_06;
    if (!bVar2) {
      return;
    }
LAB_001a76cf:
    SVar1 = this->Error_ * '\x02' + GENERATE_WRAPPER;
    break;
  case GENERATE_WRAPPER:
    GenerateWrapper(this);
    SVar1 = this->Error_ | SETTINGS_WRITE;
    __buf = extraout_RDX_03;
    break;
  case SETTINGS_WRITE:
    SettingsFileWrite(this);
    __buf = extraout_RDX_07;
LAB_001a76f1:
    if (SETTINGS_WRITE < this->Stage_) {
      return;
    }
    this->Stage_ = FINISH;
    goto LAB_001a771c;
  case FINISH:
    ::cm::uv_handle_ptr_base_<uv_async_s>::reset
              ((uv_handle_ptr_base_<uv_async_s> *)&(this->super_cmQtAutoGenerator).UVRequest_);
    this->Stage_ = END;
  default:
    goto switchD_001a75a3_default;
  }
  if (SVar1 <= this->Stage_) {
switchD_001a75a3_default:
    return;
  }
  this->Stage_ = SVar1;
LAB_001a771c:
  ::cm::uv_async_ptr::send
            (&(this->super_cmQtAutoGenerator).UVRequest_,in_ESI,__buf,(size_t)__n,in_R8D);
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::PollStage()
{
  switch (Stage_) {
    // -- Initialize
    case StageT::SETTINGS_READ:
      if (SettingsFileRead()) {
        SetStage(StageT::TEST_QRC_RCC_FILES);
      } else {
        SetStage(StageT::FINISH);
      }
      break;

    // -- Change detection
    case StageT::TEST_QRC_RCC_FILES:
      if (TestQrcRccFiles()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_RESOURCES_READ);
      }
      break;
    case StageT::TEST_RESOURCES_READ:
      if (TestResourcesRead()) {
        SetStage(StageT::TEST_RESOURCES);
      }
      break;
    case StageT::TEST_RESOURCES:
      if (TestResources()) {
        SetStage(StageT::GENERATE);
      } else {
        SetStage(StageT::TEST_INFO_FILE);
      }
      break;
    case StageT::TEST_INFO_FILE:
      TestInfoFile();
      SetStage(StageT::GENERATE_WRAPPER);
      break;

    // -- Generation
    case StageT::GENERATE:
      GenerateParentDir();
      SetStage(StageT::GENERATE_RCC);
      break;
    case StageT::GENERATE_RCC:
      if (GenerateRcc()) {
        SetStage(StageT::GENERATE_WRAPPER);
      }
      break;
    case StageT::GENERATE_WRAPPER:
      GenerateWrapper();
      SetStage(StageT::SETTINGS_WRITE);
      break;

    // -- Finalize
    case StageT::SETTINGS_WRITE:
      SettingsFileWrite();
      SetStage(StageT::FINISH);
      break;
    case StageT::FINISH:
      // Clear all libuv handles
      UVRequest().reset();
      // Set highest END stage manually
      Stage_ = StageT::END;
      break;
    case StageT::END:
      break;
  }
}